

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalCopyToFile::GetLocalSinkState(PhysicalCopyToFile *this,ExecutionContext *context)

{
  ThreadContext *pTVar1;
  CopyToFunctionGlobalState *gstate;
  pointer this_00;
  undefined8 *in_RDX;
  pointer *__ptr;
  templated_unique_single_t res;
  _Head_base<0UL,_duckdb::CopyToFunctionLocalState_*,_false> local_38;
  _Head_base<0UL,_duckdb::LocalFunctionData_*,_false> local_30;
  
  if (*(char *)((long)&context[0x28].client + 2) == '\x01') {
    gstate = (CopyToFunctionGlobalState *)
             unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                           *)(context + 3));
    local_30._M_head_impl = (LocalFunctionData *)0x0;
    make_uniq<duckdb::CopyToFunctionLocalState,decltype(nullptr)>(&local_38._M_head_impl);
    this_00 = unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
              ::operator->((unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
                            *)&local_38);
    CopyToFunctionLocalState::InitializeAppendState
              (this_00,(ClientContext *)*in_RDX,(PhysicalCopyToFile *)context,gstate);
  }
  else {
    pTVar1 = context[9].thread;
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator*
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               (context + 0x22));
    (*(code *)pTVar1)(&local_30);
    make_uniq<duckdb::CopyToFunctionLocalState,duckdb::unique_ptr<duckdb::LocalFunctionData,std::default_delete<duckdb::LocalFunctionData>,true>>
              ((duckdb *)&local_38,
               (unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                *)&local_30);
    if (local_30._M_head_impl != (LocalFunctionData *)0x0) {
      (*(local_30._M_head_impl)->_vptr_LocalFunctionData[1])();
    }
  }
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalCopyToFile::GetLocalSinkState(ExecutionContext &context) const {
	if (partition_output) {
		auto &g = sink_state->Cast<CopyToFunctionGlobalState>();

		auto state = make_uniq<CopyToFunctionLocalState>(nullptr);
		state->InitializeAppendState(context.client, *this, g);
		return std::move(state);
	}
	auto res = make_uniq<CopyToFunctionLocalState>(function.copy_to_initialize_local(context, *bind_data));
	return std::move(res);
}